

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lowmc.c
# Opt level: O3

void lowmc_record_state(lowmc_parameters_t *lowmc,lowmc_key_t *key,mzd_local_t *x,
                       recorded_state_t *state)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  recorded_state_t *prVar6;
  mzd_local_t *pmVar7;
  ulong uVar8;
  long lVar9;
  lowmc_partial_round_t *plVar10;
  uint i;
  ulong uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  mzd_local_t y [1];
  mzd_local_t y_2 [1];
  mzd_local_t x_1 [1];
  mzd_local_t local_140;
  mzd_local_t local_120;
  undefined1 local_100 [72];
  ulong local_b8;
  ulong local_90;
  ulong local_70;
  
  uVar3 = (uint)lowmc->n << 0x10 | (uint)lowmc->m;
  if ((~DAT_001c310c & 0x20400) != 0) {
    if ((int)uVar3 < 0xc00040) {
      if (uVar3 == 0x80000a) {
        mzd_xor_s128_128(&local_140,x,precomputed_constant_linear_part);
        plVar10 = rounds;
        mzd_addmul_v_s128_128(&local_140,key,precomputed_round_key_matrix_linear_part);
        mzd_mul_v_s128_128_640
                  ((mzd_local_t *)local_100,key,precomputed_round_key_matrix_non_linear_part);
        mzd_xor_s128_640((mzd_local_t *)local_100,(mzd_local_t *)local_100,
                         precomputed_constant_non_linear_part);
        lVar9 = 0;
        uVar11 = 0;
        do {
          mzd_copy_s128_128((mzd_local_t *)((long)state->state[0].w64 + lVar9),&local_140);
          uVar5 = local_140.w64[1] * 4;
          uVar8 = local_140.w64[1] & 0x9249249000000000;
          uVar4 = local_140.w64[1] * 2 & 0x9249249000000000;
          local_140.w64[1] =
               *(long *)(local_100 +
                        (ulong)((uint)uVar11 & 6) * 4 + (uVar11 >> 3 & 0x1fffffff) * 0x20) <<
               (~(byte)lVar9 & 0x20) & 0xffffffff00000000U ^ (uVar4 ^ 0x9249249000000000) & uVar5 ^
               uVar8 ^ (((uVar8 ^ 0x9249249000000000) & uVar5 ^ uVar4) >> 1 |
                       (local_140.w64[1] * 2 & uVar8 ^ uVar5 & 0x9249249000000000) >> 2 |
                       local_140.w64[1] & 0x3ffffffff) ^ uVar4;
          mzd_mul_v_parity_uint64_128_30(&local_120,&local_140,plVar10->z_matrix);
          mzd_shuffle_128_30(&local_140,plVar10->r_mask);
          mzd_addmul_v_s128_30_128(&local_120,&local_140,plVar10->r_matrix);
          local_140.w64[1] = local_140.w64[1] & 0x3ffffffff;
          mzd_xor_s128_128(&local_140,&local_120,&local_140);
          uVar11 = uVar11 + 1;
          plVar10 = plVar10 + 1;
          lVar9 = lVar9 + 0x20;
        } while (uVar11 != 0x13);
        mzd_copy_s128_128(state[0x13].state,&local_140);
        uVar11 = local_140.w64[1] * 4;
        uVar4 = local_140.w64[1] & 0x9249249000000000;
        uVar5 = local_140.w64[1] * 2 & 0x9249249000000000;
        local_140.w64[1] =
             local_b8 & 0xffffffff00000000 ^ (uVar5 ^ 0x9249249000000000) & uVar11 ^ uVar4 ^
             (((uVar4 ^ 0x9249249000000000) & uVar11 ^ uVar5) >> 1 |
             (local_140.w64[1] * 2 & uVar4 ^ uVar11 & 0x9249249000000000) >> 2 |
             local_140.w64[1] & 0x3ffffffff) ^ uVar5;
        mzd_mul_v_s128_128(&local_120,&local_140,Z_r);
        mzd_copy_s128_128(&local_140,&local_120);
        mzd_copy_s128_128(state[0x14].state,&local_140);
        return;
      }
      if (uVar3 != 0x81002b) {
        mzd_xor_s128_256(&local_140,x,precomputed_constant_linear_part);
        plVar10 = rounds;
        mzd_addmul_v_s128_192(&local_140,key,precomputed_round_key_matrix_linear_part);
        mzd_mul_v_s128_192_1024
                  ((mzd_local_t *)local_100,key,precomputed_round_key_matrix_non_linear_part);
        mzd_xor_s128_1024((mzd_local_t *)local_100,(mzd_local_t *)local_100,
                          precomputed_constant_non_linear_part);
        lVar9 = 0;
        uVar11 = 0;
        do {
          mzd_copy_s128_256((mzd_local_t *)((long)state->state[0].w64 + lVar9),&local_140);
          uVar5 = local_140.w64[2] * 4;
          uVar8 = local_140.w64[2] & 0x9249249000000000;
          uVar4 = local_140.w64[2] * 2 & 0x9249249000000000;
          local_140.w64[2] =
               *(long *)(local_100 +
                        (ulong)((uint)uVar11 & 6) * 4 + (uVar11 >> 3 & 0x1fffffff) * 0x20) <<
               (~(byte)lVar9 & 0x20) & 0xffffffff00000000U ^ (uVar4 ^ 0x9249249000000000) & uVar5 ^
               uVar8 ^ (((uVar8 ^ 0x9249249000000000) & uVar5 ^ uVar4) >> 1 |
                       (local_140.w64[2] * 2 & uVar8 ^ uVar5 & 0x9249249000000000) >> 2 |
                       local_140.w64[2] & 0x3ffffffff) ^ uVar4;
          mzd_mul_v_parity_uint64_192_30(&local_120,&local_140,plVar10->z_matrix);
          mzd_shuffle_192_30(&local_140,plVar10->r_mask);
          mzd_addmul_v_s128_30_192(&local_120,&local_140,plVar10->r_matrix);
          local_140.w64[2] = local_140.w64[2] & 0x3ffffffff;
          mzd_xor_s128_256(&local_140,&local_120,&local_140);
          uVar11 = uVar11 + 1;
          plVar10 = plVar10 + 1;
          lVar9 = lVar9 + 0x20;
        } while (uVar11 != 0x1d);
        mzd_copy_s128_256(state[0x1d].state,&local_140);
        uVar11 = local_140.w64[2] * 4;
        uVar4 = local_140.w64[2] & 0x9249249000000000;
        uVar5 = local_140.w64[2] * 2 & 0x9249249000000000;
        local_140.w64[2] =
             local_90 & 0xffffffff00000000 ^ (uVar5 ^ 0x9249249000000000) & uVar11 ^ uVar4 ^
             (((uVar4 ^ 0x9249249000000000) & uVar11 ^ uVar5) >> 1 |
             (local_140.w64[2] * 2 & uVar4 ^ uVar11 & 0x9249249000000000) >> 2 |
             local_140.w64[2] & 0x3ffffffff) ^ uVar5;
        mzd_mul_v_s128_192(&local_120,&local_140,Z_r);
        mzd_copy_s128_256(&local_140,&local_120);
        prVar6 = state + 0x1e;
LAB_00108ed0:
        pmVar7 = &local_140;
        goto LAB_00108ed6;
      }
      mzd_copy_s128_256((mzd_local_t *)local_100,x);
      mzd_addmul_v_s128_129((mzd_local_t *)local_100,key,K_0);
      lVar9 = 0;
      do {
        mzd_copy_s128_256((mzd_local_t *)((long)state->state[0].w64 + lVar9),
                          (mzd_local_t *)local_100);
        auVar15 = vandpd_avx(local_100._0_16_,_DAT_00136100);
        auVar23 = vpand_avx(local_100._16_16_,_DAT_001360d0);
        auVar16 = vandpd_avx(local_100._0_16_,_DAT_00136110);
        auVar12 = vpand_avx(local_100._16_16_,_DAT_001360e0);
        auVar24 = vandpd_avx(local_100._0_16_,_DAT_00136120);
        auVar1 = vpand_avx(local_100._16_16_,_DAT_001360f0);
        auVar18 = vpsrldq_avx(local_100._0_16_,8);
        auVar22 = vpsrldq_avx(auVar15,8);
        auVar12 = vpshldq_avx512_vbmi2(auVar12,auVar18,1);
        auVar16 = vpaddq_avx(auVar16,auVar16);
        auVar18 = vpshldq_avx512_vbmi2(auVar23,auVar22,2);
        auVar23 = vpslldq_avx(auVar15,8);
        auVar22 = vpshldq_avx512_vbmi2(auVar15,auVar23,2);
        auVar15 = vpand_avx(auVar18,auVar1);
        auVar13 = vpternlogq_avx512vl(auVar18,auVar12,auVar1,0x78);
        auVar14 = vpternlogq_avx512vl(auVar22,auVar16,auVar24,0x78);
        auVar25 = vpslldq_avx(auVar13,8);
        auVar23 = vpand_avx(auVar22,auVar24);
        auVar15 = vpternlogq_avx512vl(auVar15,auVar12,auVar18,0x96);
        auVar13 = vpsrlq_avx(auVar13,2);
        auVar26 = vpsrldq_avx(auVar14,8);
        auVar23 = vpternlogq_avx512vl(auVar23,auVar16,auVar22,0x96);
        auVar25 = vpsllq_avx(auVar25,0x3e);
        auVar12 = vpternlogq_avx512vl(auVar13,auVar12,auVar18,0xfe);
        auVar18 = vpshldq_avx512_vbmi2(auVar26,auVar14,0x3e);
        auVar13 = vpslldq_avx(auVar15,8);
        auVar15 = vpsrlq_avx(auVar15,1);
        auVar23 = vpshldq_avx512_vbmi2(auVar13,auVar23,0x3f);
        local_100._16_16_ = vpternlogq_avx512vl(auVar12,auVar1,auVar15,0x96);
        auVar15 = vpor_avx(auVar18,auVar25);
        auVar15 = vpternlogq_avx512vl(auVar15,auVar22,auVar16,0xfe);
        local_100._0_16_ = vpternlogq_avx512vl(auVar15,auVar24,auVar23,0x96);
        mzd_mul_v_s128_129(&local_140,(mzd_local_t *)local_100,
                           *(mzd_local_t **)((long)&rounds[0].l_matrix + lVar9));
        mzd_xor_s128_256((mzd_local_t *)local_100,&local_140,
                         *(mzd_local_t **)((long)&rounds[0].constant + lVar9));
        mzd_addmul_v_s128_129
                  ((mzd_local_t *)local_100,key,*(mzd_local_t **)((long)&rounds[0].k_matrix + lVar9)
                  );
        lVar9 = lVar9 + 0x20;
      } while (lVar9 != 0x80);
    }
    else if (uVar3 == 0xc00040) {
      mzd_copy_s128_256((mzd_local_t *)local_100,x);
      mzd_addmul_v_s128_192((mzd_local_t *)local_100,key,K_0);
      lVar9 = 0;
      do {
        mzd_copy_s128_256((mzd_local_t *)((long)state->state[0].w64 + lVar9),
                          (mzd_local_t *)local_100);
        auVar15 = vandpd_avx(local_100._0_16_,_DAT_001360b0);
        auVar23 = vpand_avx(local_100._16_16_,_DAT_001360d0);
        auVar16 = vandpd_avx(local_100._0_16_,_DAT_00136090);
        auVar12 = vpand_avx(local_100._16_16_,_DAT_001360e0);
        auVar24 = vandpd_avx(local_100._0_16_,_DAT_001360a0);
        auVar1 = vpand_avx(local_100._16_16_,_DAT_001360f0);
        auVar18 = vpsrldq_avx(local_100._0_16_,8);
        auVar22 = vpsrldq_avx(auVar15,8);
        auVar18 = vpshldq_avx512_vbmi2(auVar12,auVar18,1);
        auVar16 = vpaddq_avx(auVar16,auVar16);
        auVar22 = vpshldq_avx512_vbmi2(auVar23,auVar22,2);
        auVar23 = vpslldq_avx(auVar15,8);
        auVar13 = vpshldq_avx512_vbmi2(auVar15,auVar23,2);
        auVar15 = vpand_avx(auVar22,auVar1);
        auVar23 = vpand_avx(auVar13,auVar24);
        auVar12 = vpor_avx(auVar13,auVar16);
        auVar15 = vpternlogq_avx512vl(auVar15,auVar18,auVar22,0x96);
        auVar23 = vpternlogq_avx512vl(auVar23,auVar16,auVar13,0x96);
        auVar16 = vpternlogq_avx512vl(auVar13,auVar16,auVar24,0x78);
        auVar13 = vpternlogq_avx512vl(auVar22,auVar18,auVar1,0x78);
        auVar25 = vpsrldq_avx(auVar16,8);
        auVar14 = vpslldq_avx(auVar13,8);
        auVar13 = vpsrlq_avx(auVar13,2);
        auVar16 = vpshldq_avx512_vbmi2(auVar25,auVar16,0x3e);
        auVar14 = vpsllq_avx(auVar14,0x3e);
        auVar18 = vpternlogq_avx512vl(auVar13,auVar18,auVar22,0xfe);
        auVar16 = vpternlogq_avx512vl(auVar16,auVar12,auVar14,0x36);
        auVar22 = vpslldq_avx(auVar15,8);
        auVar12 = vpsrlq_avx(auVar15,1);
        auVar15 = vpshldq_avx512_vbmi2(auVar22,auVar23,0x3f);
        local_100._16_16_ = vpternlogq_avx512vl(auVar18,auVar1,auVar12,0x96);
        local_100._0_16_ = vpternlogq_avx512vl(auVar15,auVar24,auVar16,0x96);
        mzd_mul_v_s128_192(&local_140,(mzd_local_t *)local_100,
                           *(mzd_local_t **)((long)&rounds[0].l_matrix + lVar9));
        mzd_xor_s128_256((mzd_local_t *)local_100,&local_140,
                         *(mzd_local_t **)((long)&rounds[0].constant + lVar9));
        mzd_addmul_v_s128_192
                  ((mzd_local_t *)local_100,key,*(mzd_local_t **)((long)&rounds[0].k_matrix + lVar9)
                  );
        lVar9 = lVar9 + 0x20;
      } while (lVar9 != 0x80);
    }
    else {
      if (uVar3 != 0xff0055) {
        mzd_xor_s128_256(&local_140,x,precomputed_constant_linear_part);
        plVar10 = rounds;
        mzd_addmul_v_s128_256(&local_140,key,precomputed_round_key_matrix_linear_part);
        mzd_mul_v_s128_256_1280
                  ((mzd_local_t *)local_100,key,precomputed_round_key_matrix_non_linear_part);
        mzd_xor_s128_1280((mzd_local_t *)local_100,(mzd_local_t *)local_100,
                          precomputed_constant_non_linear_part);
        lVar9 = 0;
        uVar11 = 0;
        do {
          mzd_copy_s128_256((mzd_local_t *)((long)state->state[0].w64 + lVar9),&local_140);
          uVar5 = local_140.w64[3] * 4;
          uVar8 = local_140.w64[3] & 0x9249249000000000;
          uVar4 = local_140.w64[3] * 2 & 0x9249249000000000;
          local_140.w64[3] =
               *(long *)(local_100 +
                        (ulong)((uint)uVar11 & 6) * 4 + (uVar11 >> 3 & 0x1fffffff) * 0x20) <<
               (~(byte)lVar9 & 0x20) & 0xffffffff00000000U ^ (uVar4 ^ 0x9249249000000000) & uVar5 ^
               uVar8 ^ (((uVar8 ^ 0x9249249000000000) & uVar5 ^ uVar4) >> 1 |
                       (local_140.w64[3] * 2 & uVar8 ^ uVar5 & 0x9249249000000000) >> 2 |
                       local_140.w64[3] & 0x3ffffffff) ^ uVar4;
          mzd_mul_v_parity_uint64_256_30(&local_120,&local_140,plVar10->z_matrix);
          mzd_shuffle_256_30(&local_140,plVar10->r_mask);
          mzd_addmul_v_s128_30_256(&local_120,&local_140,plVar10->r_matrix);
          local_140.w64[3] = local_140.w64[3] & 0x3ffffffff;
          mzd_xor_s128_256(&local_140,&local_120,&local_140);
          uVar11 = uVar11 + 1;
          plVar10 = plVar10 + 1;
          lVar9 = lVar9 + 0x20;
        } while (uVar11 != 0x25);
        mzd_copy_s128_256(state[0x25].state,&local_140);
        uVar11 = local_140.w64[3] * 4;
        uVar4 = local_140.w64[3] & 0x9249249000000000;
        uVar5 = local_140.w64[3] * 2 & 0x9249249000000000;
        local_140.w64[3] =
             local_70 & 0xffffffff00000000 ^ (uVar5 ^ 0x9249249000000000) & uVar11 ^ uVar4 ^
             (((uVar4 ^ 0x9249249000000000) & uVar11 ^ uVar5) >> 1 |
             (local_140.w64[3] * 2 & uVar4 ^ uVar11 & 0x9249249000000000) >> 2 |
             local_140.w64[3] & 0x3ffffffff) ^ uVar5;
        mzd_mul_v_s128_256(&local_120,&local_140,Z_r);
        mzd_copy_s128_256(&local_140,&local_120);
        prVar6 = state + 0x26;
        goto LAB_00108ed0;
      }
      mzd_copy_s128_256((mzd_local_t *)local_100,x);
      mzd_addmul_v_s128_256((mzd_local_t *)local_100,key,K_0);
      lVar9 = 0;
      do {
        mzd_copy_s128_256((mzd_local_t *)((long)state->state[0].w64 + lVar9),
                          (mzd_local_t *)local_100);
        auVar15 = vandpd_avx(local_100._16_16_,_DAT_001360b0);
        auVar16 = vandpd_avx(local_100._0_16_,_DAT_00136090);
        auVar24 = vandpd_avx(local_100._16_16_,_DAT_001360a0);
        auVar23 = vandpd_avx(local_100._0_16_,_DAT_001360a0);
        auVar12 = vandpd_avx(local_100._0_16_,_DAT_001360c0);
        auVar1 = vandpd_avx(local_100._16_16_,_DAT_00136090);
        auVar18 = vpslldq_avx(local_100._16_16_,8);
        auVar13 = vpslldq_avx(auVar24,8);
        auVar22 = vpsrldq_avx(auVar16,8);
        auVar18 = vpshldq_avx512_vbmi2(auVar15,auVar18,1);
        auVar14 = vpsllq_avx(auVar16,2);
        auVar15 = vpaddq_avx(auVar23,auVar23);
        auVar16 = vpshldq_avx512_vbmi2(auVar24,auVar13,2);
        auVar24 = vpsrlq_avx(auVar22,0x3e);
        auVar24 = vpor_avx(auVar16,auVar24);
        auVar16 = vpand_avx(auVar24,auVar1);
        auVar23 = vpternlogq_avx512vl(auVar24,auVar18,auVar1,0x78);
        auVar22 = vpternlogq_avx512vl(auVar16,auVar18,auVar24,0x96);
        auVar25 = vpslldq_avx(auVar23,8);
        auVar16 = vpsrldq_avx(auVar23,8);
        auVar23 = vpshldq_avx512_vbmi2(auVar16,auVar23,0x3e);
        auVar27 = vpslldq_avx(auVar22,8);
        auVar26 = vpsrldq_avx(auVar22,8);
        auVar16 = vpand_avx(auVar14,auVar12);
        auVar13 = vpternlogq_avx512vl(auVar14,auVar15,auVar12,0x78);
        auVar22 = vpshldq_avx512_vbmi2(auVar26,auVar22,0x3f);
        auVar16 = vpternlogq_avx512vl(auVar16,auVar15,auVar14,0x96);
        auVar13 = vpshldq_avx512_vbmi2(auVar25,auVar13,0x3e);
        auVar24 = vpternlogq_avx512vl(auVar23,auVar24,auVar18,0x1e);
        auVar16 = vpshldq_avx512_vbmi2(auVar27,auVar16,0x3f);
        local_100._16_16_ = vpternlogq_avx512vl(auVar24,auVar1,auVar22,0x96);
        auVar15 = vpternlogq_avx512vl(auVar13,auVar14,auVar15,0x1e);
        local_100._0_16_ = vpternlogq_avx512vl(auVar15,auVar12,auVar16,0x96);
        mzd_mul_v_s128_256(&local_140,(mzd_local_t *)local_100,
                           *(mzd_local_t **)((long)&rounds[0].l_matrix + lVar9));
        mzd_xor_s128_256((mzd_local_t *)local_100,&local_140,
                         *(mzd_local_t **)((long)&rounds[0].constant + lVar9));
        mzd_addmul_v_s128_256
                  ((mzd_local_t *)local_100,key,*(mzd_local_t **)((long)&rounds[0].k_matrix + lVar9)
                  );
        lVar9 = lVar9 + 0x20;
      } while (lVar9 != 0x80);
    }
    prVar6 = state + 4;
    pmVar7 = (mzd_local_t *)local_100;
LAB_00108ed6:
    mzd_copy_s128_256(prVar6->state,pmVar7);
    return;
  }
  if ((int)uVar3 < 0xc00040) {
    if (uVar3 == 0x80000a) {
      mzd_xor_s256_128(&local_140,x,precomputed_constant_linear_part);
      plVar10 = rounds;
      mzd_addmul_v_s256_128(&local_140,key,precomputed_round_key_matrix_linear_part);
      mzd_mul_v_s256_128_768
                ((mzd_local_t *)local_100,key,precomputed_round_key_matrix_non_linear_part);
      mzd_xor_s256_768((mzd_local_t *)local_100,(mzd_local_t *)local_100,
                       precomputed_constant_non_linear_part);
      lVar9 = 0;
      uVar11 = 0;
      do {
        mzd_copy_s256_128((mzd_local_t *)((long)state->state[0].w64 + lVar9),&local_140);
        uVar5 = local_140.w64[1] * 4;
        uVar8 = local_140.w64[1] & 0x9249249000000000;
        uVar4 = local_140.w64[1] * 2 & 0x9249249000000000;
        local_140.w64[1] =
             *(long *)(local_100 + (ulong)((uint)uVar11 & 6) * 4 + (uVar11 >> 3 & 0x1fffffff) * 0x20
                      ) << (~(byte)lVar9 & 0x20) & 0xffffffff00000000U ^
             (uVar4 ^ 0x9249249000000000) & uVar5 ^ uVar8 ^
             (((uVar8 ^ 0x9249249000000000) & uVar5 ^ uVar4) >> 1 |
             (local_140.w64[1] * 2 & uVar8 ^ uVar5 & 0x9249249000000000) >> 2 |
             local_140.w64[1] & 0x3ffffffff) ^ uVar4;
        mzd_mul_v_parity_uint64_128_30(&local_120,&local_140,plVar10->z_matrix);
        mzd_shuffle_pext_128_30(&local_140,plVar10->r_mask);
        mzd_addmul_v_s256_30_128(&local_120,&local_140,plVar10->r_matrix);
        local_140.w64[1] = local_140.w64[1] & 0x3ffffffff;
        mzd_xor_s256_128(&local_140,&local_120,&local_140);
        uVar11 = uVar11 + 1;
        plVar10 = plVar10 + 1;
        lVar9 = lVar9 + 0x20;
      } while (uVar11 != 0x13);
      mzd_copy_s256_128(state[0x13].state,&local_140);
      uVar11 = local_140.w64[1] * 4;
      uVar4 = local_140.w64[1] & 0x9249249000000000;
      uVar5 = local_140.w64[1] * 2 & 0x9249249000000000;
      local_140.w64[1] =
           local_b8 & 0xffffffff00000000 ^ (uVar5 ^ 0x9249249000000000) & uVar11 ^ uVar4 ^
           (((uVar4 ^ 0x9249249000000000) & uVar11 ^ uVar5) >> 1 |
           (local_140.w64[1] * 2 & uVar4 ^ uVar11 & 0x9249249000000000) >> 2 |
           local_140.w64[1] & 0x3ffffffff) ^ uVar5;
      mzd_mul_v_s256_128(&local_120,&local_140,Z_r);
      mzd_copy_s256_128(&local_140,&local_120);
      mzd_copy_s256_128(state[0x14].state,&local_140);
      return;
    }
    if (uVar3 != 0x81002b) {
      mzd_xor_s256_256(&local_140,x,precomputed_constant_linear_part);
      plVar10 = rounds;
      mzd_addmul_v_s256_192(&local_140,key,precomputed_round_key_matrix_linear_part);
      mzd_mul_v_s256_192_1024
                ((mzd_local_t *)local_100,key,precomputed_round_key_matrix_non_linear_part);
      mzd_xor_s256_1024((mzd_local_t *)local_100,(mzd_local_t *)local_100,
                        precomputed_constant_non_linear_part);
      lVar9 = 0;
      uVar11 = 0;
      do {
        mzd_copy_s256_256((mzd_local_t *)((long)state->state[0].w64 + lVar9),&local_140);
        uVar5 = local_140.w64[2] * 4;
        uVar8 = local_140.w64[2] & 0x9249249000000000;
        uVar4 = local_140.w64[2] * 2 & 0x9249249000000000;
        local_140.w64[2] =
             *(long *)(local_100 + (ulong)((uint)uVar11 & 6) * 4 + (uVar11 >> 3 & 0x1fffffff) * 0x20
                      ) << (~(byte)lVar9 & 0x20) & 0xffffffff00000000U ^
             (uVar4 ^ 0x9249249000000000) & uVar5 ^ uVar8 ^
             (((uVar8 ^ 0x9249249000000000) & uVar5 ^ uVar4) >> 1 |
             (local_140.w64[2] * 2 & uVar8 ^ uVar5 & 0x9249249000000000) >> 2 |
             local_140.w64[2] & 0x3ffffffff) ^ uVar4;
        mzd_mul_v_parity_uint64_192_30(&local_120,&local_140,plVar10->z_matrix);
        mzd_shuffle_pext_192_30(&local_140,plVar10->r_mask);
        mzd_addmul_v_s256_30_192(&local_120,&local_140,plVar10->r_matrix);
        local_140.w64[2] = local_140.w64[2] & 0x3ffffffff;
        mzd_xor_s256_256(&local_140,&local_120,&local_140);
        uVar11 = uVar11 + 1;
        plVar10 = plVar10 + 1;
        lVar9 = lVar9 + 0x20;
      } while (uVar11 != 0x1d);
      mzd_copy_s256_256(state[0x1d].state,&local_140);
      uVar11 = local_140.w64[2] * 4;
      uVar4 = local_140.w64[2] & 0x9249249000000000;
      uVar5 = local_140.w64[2] * 2 & 0x9249249000000000;
      local_140.w64[2] =
           local_90 & 0xffffffff00000000 ^ (uVar5 ^ 0x9249249000000000) & uVar11 ^ uVar4 ^
           (((uVar4 ^ 0x9249249000000000) & uVar11 ^ uVar5) >> 1 |
           (local_140.w64[2] * 2 & uVar4 ^ uVar11 & 0x9249249000000000) >> 2 |
           local_140.w64[2] & 0x3ffffffff) ^ uVar5;
      mzd_mul_v_s256_192(&local_120,&local_140,Z_r);
      mzd_copy_s256_256(&local_140,&local_120);
      prVar6 = state + 0x1e;
LAB_00108c8b:
      pmVar7 = &local_140;
      goto LAB_00108c91;
    }
    mzd_copy_s256_256((mzd_local_t *)local_100,x);
    mzd_addmul_v_s256_129((mzd_local_t *)local_100,key,K_0);
    lVar9 = 0;
    do {
      mzd_copy_s256_256((mzd_local_t *)((long)state->state[0].w64 + lVar9),(mzd_local_t *)local_100)
      ;
      auVar19 = vpand_avx2(local_100._0_32_,_DAT_00136200);
      auVar20 = vpand_avx2(local_100._0_32_,_DAT_00136220);
      auVar2 = vpand_avx2(local_100._0_32_,_DAT_00136240);
      auVar21 = vpsllq_avx2(auVar19,2);
      auVar19 = vpsrlq_avx2(auVar19,0x3e);
      auVar19 = vpermq_avx2(auVar19,0x93);
      auVar21 = vpor_avx2(auVar19,auVar21);
      auVar19 = vpaddq_avx2(auVar20,auVar20);
      auVar20 = vpsrlq_avx2(auVar20,0x3f);
      auVar20 = vpermq_avx2(auVar20,0x93);
      auVar20 = vpor_avx2(auVar20,auVar19);
      auVar19 = vpand_avx2(auVar21,auVar2);
      auVar17 = vpternlogq_avx512vl(auVar19,auVar20,auVar21,0x96);
      auVar19 = vpor_avx2(auVar21,auVar20);
      auVar20 = vpternlogq_avx512vl(auVar21,auVar20,auVar2,0x78);
      auVar21 = vpsrlq_avx2(auVar20,2);
      auVar20 = vpsllq_avx2(auVar20,0x3e);
      auVar20 = vpermq_avx2(auVar20,0x39);
      auVar20 = vpternlogq_avx512vl(auVar20,auVar19,auVar21,0x36);
      auVar21 = vpsrlq_avx2(auVar17,1);
      auVar19 = vpsllq_avx2(auVar17,0x3f);
      auVar19 = vpermq_avx2(auVar19,0x39);
      auVar19 = vpor_avx2(auVar19,auVar21);
      local_100._0_32_ = vpternlogq_avx512vl(auVar19,auVar2,auVar20,0x96);
      mzd_mul_v_s256_129(&local_140,(mzd_local_t *)local_100,
                         *(mzd_local_t **)((long)&rounds[0].l_matrix + lVar9));
      mzd_xor_s256_256((mzd_local_t *)local_100,&local_140,
                       *(mzd_local_t **)((long)&rounds[0].constant + lVar9));
      mzd_addmul_v_s256_129
                ((mzd_local_t *)local_100,key,*(mzd_local_t **)((long)&rounds[0].k_matrix + lVar9));
      lVar9 = lVar9 + 0x20;
    } while (lVar9 != 0x80);
  }
  else if (uVar3 == 0xc00040) {
    mzd_copy_s256_256((mzd_local_t *)local_100,x);
    mzd_addmul_v_s256_192((mzd_local_t *)local_100,key,K_0);
    lVar9 = 0;
    do {
      mzd_copy_s256_256((mzd_local_t *)((long)state->state[0].w64 + lVar9),(mzd_local_t *)local_100)
      ;
      auVar19 = vpand_avx2(local_100._0_32_,_DAT_001361a0);
      auVar20 = vpand_avx2(local_100._0_32_,_DAT_001361c0);
      auVar2 = vpand_avx2(local_100._0_32_,_DAT_001361e0);
      auVar21 = vpsllq_avx2(auVar19,2);
      auVar19 = vpsrlq_avx2(auVar19,0x3e);
      auVar19 = vpermq_avx2(auVar19,0x93);
      auVar21 = vpor_avx2(auVar19,auVar21);
      auVar19 = vpaddq_avx2(auVar20,auVar20);
      auVar20 = vpsrlq_avx2(auVar20,0x3f);
      auVar20 = vpermq_avx2(auVar20,0x93);
      auVar20 = vpor_avx2(auVar20,auVar19);
      auVar19 = vpand_avx2(auVar21,auVar2);
      auVar17 = vpternlogq_avx512vl(auVar19,auVar20,auVar21,0x96);
      auVar19 = vpor_avx2(auVar21,auVar20);
      auVar20 = vpternlogq_avx512vl(auVar21,auVar20,auVar2,0x78);
      auVar21 = vpsrlq_avx2(auVar20,2);
      auVar20 = vpsllq_avx2(auVar20,0x3e);
      auVar20 = vpermq_avx2(auVar20,0x39);
      auVar20 = vpternlogq_avx512vl(auVar20,auVar19,auVar21,0x36);
      auVar21 = vpsrlq_avx2(auVar17,1);
      auVar19 = vpsllq_avx2(auVar17,0x3f);
      auVar19 = vpermq_avx2(auVar19,0x39);
      auVar19 = vpor_avx2(auVar19,auVar21);
      local_100._0_32_ = vpternlogq_avx512vl(auVar19,auVar2,auVar20,0x96);
      mzd_mul_v_s256_192(&local_140,(mzd_local_t *)local_100,
                         *(mzd_local_t **)((long)&rounds[0].l_matrix + lVar9));
      mzd_xor_s256_256((mzd_local_t *)local_100,&local_140,
                       *(mzd_local_t **)((long)&rounds[0].constant + lVar9));
      mzd_addmul_v_s256_192
                ((mzd_local_t *)local_100,key,*(mzd_local_t **)((long)&rounds[0].k_matrix + lVar9));
      lVar9 = lVar9 + 0x20;
    } while (lVar9 != 0x80);
  }
  else {
    if (uVar3 != 0xff0055) {
      mzd_xor_s256_256(&local_140,x,precomputed_constant_linear_part);
      plVar10 = rounds;
      mzd_addmul_v_s256_256(&local_140,key,precomputed_round_key_matrix_linear_part);
      mzd_mul_v_s256_256_1280
                ((mzd_local_t *)local_100,key,precomputed_round_key_matrix_non_linear_part);
      mzd_xor_s256_1280((mzd_local_t *)local_100,(mzd_local_t *)local_100,
                        precomputed_constant_non_linear_part);
      lVar9 = 0;
      uVar11 = 0;
      do {
        mzd_copy_s256_256((mzd_local_t *)((long)state->state[0].w64 + lVar9),&local_140);
        uVar5 = local_140.w64[3] * 4;
        uVar8 = local_140.w64[3] & 0x9249249000000000;
        uVar4 = local_140.w64[3] * 2 & 0x9249249000000000;
        local_140.w64[3] =
             *(long *)(local_100 + (ulong)((uint)uVar11 & 6) * 4 + (uVar11 >> 3 & 0x1fffffff) * 0x20
                      ) << (~(byte)lVar9 & 0x20) & 0xffffffff00000000U ^
             (uVar4 ^ 0x9249249000000000) & uVar5 ^ uVar8 ^
             (((uVar8 ^ 0x9249249000000000) & uVar5 ^ uVar4) >> 1 |
             (local_140.w64[3] * 2 & uVar8 ^ uVar5 & 0x9249249000000000) >> 2 |
             local_140.w64[3] & 0x3ffffffff) ^ uVar4;
        mzd_mul_v_parity_s256_256_30(&local_120,&local_140,plVar10->z_matrix);
        mzd_shuffle_pext_256_30(&local_140,plVar10->r_mask);
        mzd_addmul_v_s256_30_256(&local_120,&local_140,plVar10->r_matrix);
        local_140.w64[3] = local_140.w64[3] & 0x3ffffffff;
        mzd_xor_s256_256(&local_140,&local_120,&local_140);
        uVar11 = uVar11 + 1;
        plVar10 = plVar10 + 1;
        lVar9 = lVar9 + 0x20;
      } while (uVar11 != 0x25);
      mzd_copy_s256_256(state[0x25].state,&local_140);
      uVar11 = local_140.w64[3] * 4;
      uVar4 = local_140.w64[3] & 0x9249249000000000;
      uVar5 = local_140.w64[3] * 2 & 0x9249249000000000;
      local_140.w64[3] =
           local_70 & 0xffffffff00000000 ^ (uVar5 ^ 0x9249249000000000) & uVar11 ^ uVar4 ^
           (((uVar4 ^ 0x9249249000000000) & uVar11 ^ uVar5) >> 1 |
           (local_140.w64[3] * 2 & uVar4 ^ uVar11 & 0x9249249000000000) >> 2 |
           local_140.w64[3] & 0x3ffffffff) ^ uVar5;
      mzd_mul_v_s256_256(&local_120,&local_140,Z_r);
      mzd_copy_s256_256(&local_140,&local_120);
      prVar6 = state + 0x26;
      goto LAB_00108c8b;
    }
    mzd_copy_s256_256((mzd_local_t *)local_100,x);
    mzd_addmul_v_s256_256((mzd_local_t *)local_100,key,K_0);
    lVar9 = 0;
    do {
      mzd_copy_s256_256((mzd_local_t *)((long)state->state[0].w64 + lVar9),(mzd_local_t *)local_100)
      ;
      auVar19 = vpand_avx2(local_100._0_32_,_DAT_00136140);
      auVar20 = vpand_avx2(local_100._0_32_,_DAT_00136160);
      auVar2 = vpand_avx2(local_100._0_32_,_DAT_00136180);
      auVar21 = vpsllq_avx2(auVar19,2);
      auVar19 = vpsrlq_avx2(auVar19,0x3e);
      auVar19 = vpermq_avx2(auVar19,0x93);
      auVar21 = vpor_avx2(auVar19,auVar21);
      auVar19 = vpaddq_avx2(auVar20,auVar20);
      auVar20 = vpsrlq_avx2(auVar20,0x3f);
      auVar20 = vpermq_avx2(auVar20,0x93);
      auVar20 = vpor_avx2(auVar20,auVar19);
      auVar19 = vpand_avx2(auVar21,auVar2);
      auVar17 = vpternlogq_avx512vl(auVar19,auVar20,auVar21,0x96);
      auVar19 = vpor_avx2(auVar21,auVar20);
      auVar20 = vpternlogq_avx512vl(auVar21,auVar20,auVar2,0x78);
      auVar21 = vpsrlq_avx2(auVar20,2);
      auVar20 = vpsllq_avx2(auVar20,0x3e);
      auVar20 = vpermq_avx2(auVar20,0x39);
      auVar20 = vpternlogq_avx512vl(auVar20,auVar19,auVar21,0x36);
      auVar21 = vpsrlq_avx2(auVar17,1);
      auVar19 = vpsllq_avx2(auVar17,0x3f);
      auVar19 = vpermq_avx2(auVar19,0x39);
      auVar19 = vpor_avx2(auVar19,auVar21);
      local_100._0_32_ = vpternlogq_avx512vl(auVar19,auVar2,auVar20,0x96);
      mzd_mul_v_s256_256(&local_140,(mzd_local_t *)local_100,
                         *(mzd_local_t **)((long)&rounds[0].l_matrix + lVar9));
      mzd_xor_s256_256((mzd_local_t *)local_100,&local_140,
                       *(mzd_local_t **)((long)&rounds[0].constant + lVar9));
      mzd_addmul_v_s256_256
                ((mzd_local_t *)local_100,key,*(mzd_local_t **)((long)&rounds[0].k_matrix + lVar9));
      lVar9 = lVar9 + 0x20;
    } while (lVar9 != 0x80);
  }
  prVar6 = state + 4;
  pmVar7 = (mzd_local_t *)local_100;
LAB_00108c91:
  mzd_copy_s256_256(prVar6->state,pmVar7);
  return;
}

Assistant:

void lowmc_record_state(const lowmc_parameters_t* lowmc, const lowmc_key_t* key,
                        const mzd_local_t* x, recorded_state_t* state) {
  const uint32_t lowmc_id = lowmc_get_id(lowmc);
#if defined(WITH_OPT)
#if defined(WITH_AVX2)
  /* AVX2 enabled instances */
  if (CPU_SUPPORTS_AVX2) {
    switch (lowmc_id) {
      /* Instances with partial Sbox layer */
#if defined(WITH_LOWMC_128_128_20)
    case LOWMC_ID(128, 10):
      lowmc_store_s256_lowmc_128_128_20(key, x, state);
      return;
#endif
#if defined(WITH_LOWMC_192_192_30)
    case LOWMC_ID(192, 10):
      lowmc_store_s256_lowmc_192_192_30(key, x, state);
      return;
#endif
#if defined(WITH_LOWMC_256_256_38)
    case LOWMC_ID(256, 10):
      lowmc_store_s256_lowmc_256_256_38(key, x, state);
      return;
#endif
      /* Instances with full Sbox layer */
#if defined(WITH_LOWMC_129_129_4)
    case LOWMC_ID(129, 43):
      lowmc_store_s256_lowmc_129_129_4(key, x, state);
      return;
#endif
#if defined(WITH_LOWMC_192_192_4)
    case LOWMC_ID(192, 64):
      lowmc_store_s256_lowmc_192_192_4(key, x, state);
      return;
#endif
#if defined(WITH_LOWMC_255_255_4)
    case LOWMC_ID(255, 85):
      lowmc_store_s256_lowmc_255_255_4(key, x, state);
      return;
#endif
    }
  }
#endif

#if defined(WITH_SSE2) || defined(WITH_NEON)
  /* SSE2/NEON enabled instances */
  if (CPU_SUPPORTS_SSE2 || CPU_SUPPORTS_NEON) {
    switch (lowmc_id) {
      /* Instances with partial Sbox layer */
#if defined(WITH_LOWMC_128_128_20)
    case LOWMC_ID(128, 10):
      lowmc_store_s128_lowmc_128_128_20(key, x, state);
      return;
#endif
#if defined(WITH_LOWMC_192_192_30)
    case LOWMC_ID(192, 10):
      lowmc_store_s128_lowmc_192_192_30(key, x, state);
      return;
#endif
#if defined(WITH_LOWMC_256_256_38)
    case LOWMC_ID(256, 10):
      lowmc_store_s128_lowmc_256_256_38(key, x, state);
      return;
#endif
      /* Instances with full Sbox layer */
#if defined(WITH_LOWMC_129_129_4)
    case LOWMC_ID(129, 43):
      lowmc_store_s128_lowmc_129_129_4(key, x, state);
      return;
#endif
#if defined(WITH_LOWMC_192_192_4)
    case LOWMC_ID(192, 64):
      lowmc_store_s128_lowmc_192_192_4(key, x, state);
      return;
#endif
#if defined(WITH_LOWMC_255_255_4)
    case LOWMC_ID(255, 85):
      lowmc_store_s128_lowmc_255_255_4(key, x, state);
      return;
#endif
    }
  }
#endif
#endif

#if !defined(NO_UINT64_FALLBACK)
  /* uint64_t implementations */
  switch (lowmc_id) {
    /* Instances with partial Sbox layer */
#if defined(WITH_LOWMC_128_128_20)
  case LOWMC_ID(128, 10):
    lowmc_store_uint64_lowmc_128_128_20(key, x, state);
    return;
#endif
#if defined(WITH_LOWMC_192_192_30)
  case LOWMC_ID(192, 10):
    lowmc_store_uint64_lowmc_192_192_30(key, x, state);
    return;
#endif
#if defined(WITH_LOWMC_256_256_38)
  case LOWMC_ID(256, 10):
    lowmc_store_uint64_lowmc_256_256_38(key, x, state);
    return;
#endif
    /* Instances with full Sbox layer */
#if defined(WITH_LOWMC_129_129_4)
  case LOWMC_ID(129, 43):
    lowmc_store_uint64_lowmc_129_129_4(key, x, state);
    return;
#endif
#if defined(WITH_LOWMC_192_192_4)
  case LOWMC_ID(192, 64):
    lowmc_store_uint64_lowmc_192_192_4(key, x, state);
    return;
#endif
#if defined(WITH_LOWMC_255_255_4)
  case LOWMC_ID(255, 85):
    lowmc_store_uint64_lowmc_255_255_4(key, x, state);
    return;
#endif
  }
#endif

  UNREACHABLE;
}